

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.h
# Opt level: O0

void __thiscall
slang::ast::ConfigBlockSymbol::ConfigBlockSymbol
          (ConfigBlockSymbol *this,Compilation *compilation,string_view name,SourceLocation loc)

{
  string_view name_00;
  char *in_RCX;
  size_t in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  Compilation *in_stack_ffffffffffffffa8;
  Scope *in_stack_ffffffffffffffb0;
  
  name_00._M_str = in_RCX;
  name_00._M_len = in_RDX;
  Symbol::Symbol(in_RDI,ConfigBlock,name_00,in_R8);
  Scope::Scope(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
  *(undefined1 *)&in_RDI[1].originatingSyntax = 0;
  std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>::span
            ((span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> *)0x86cebc)
  ;
  std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>::span
            ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)0x86cecd);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
              *)in_R8);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
              *)in_R8);
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
              *)in_R8);
  *(undefined1 *)&in_RDI[4].indexInScope = 0;
  return;
}

Assistant:

ConfigBlockSymbol(Compilation& compilation, std::string_view name, SourceLocation loc) :
        Symbol(SymbolKind::ConfigBlock, name, loc), Scope(compilation, this) {}